

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

CCommandInfo * __thiscall
CConsole::GetCommandInfo(CConsole *this,char *pName,int FlagMask,bool Temp)

{
  CCommand *pCVar1;
  int iVar2;
  
  pCVar1 = this->m_pFirstCommand;
  while ((pCVar1 != (CCommand *)0x0 &&
         ((((pCVar1->m_Flags & FlagMask) == 0 || (pCVar1->m_Temp != Temp)) ||
          (iVar2 = str_comp_nocase((pCVar1->super_CCommandInfo).m_pName,pName), iVar2 != 0))))) {
    pCVar1 = pCVar1->m_pNext;
  }
  return &pCVar1->super_CCommandInfo;
}

Assistant:

const IConsole::CCommandInfo *CConsole::GetCommandInfo(const char *pName, int FlagMask, bool Temp)
{
	for(CCommand *pCommand = m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&FlagMask && pCommand->m_Temp == Temp)
		{
			if(str_comp_nocase(pCommand->m_pName, pName) == 0)
				return pCommand;
		}
	}

	return 0;
}